

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O1

int smem_create(char *filename,int *driverhandle)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 *puVar2;
  int iVar3;
  int h;
  undefined8 uStack_18;
  
  iVar3 = 0x98;
  if (driverhandle != (int *)0x0 && filename != (char *)0x0) {
    uStack_18 = in_RAX;
    iVar1 = __isoc99_sscanf(filename,"h%d",(long)&uStack_18 + 4);
    iVar3 = 0x97;
    if (iVar1 == 1) {
      iVar1 = shared_malloc(0xb50,0xc,uStack_18._4_4_);
      if (iVar1 == -1) {
        iVar3 = 0x9c;
      }
      else {
        uStack_18._4_4_ = iVar1;
        puVar2 = (undefined4 *)shared_lock(iVar1,1);
        if (puVar2 == (undefined4 *)0x0) {
          shared_free(uStack_18._4_4_);
        }
        else {
          *puVar2 = 0x19630114;
          puVar2[1] = uStack_18._4_4_;
          *(undefined8 *)(puVar2 + 2) = 0xffffffff00000b50;
          *driverhandle = uStack_18._4_4_;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int     smem_create(char *filename, int *driverhandle)
 { DAL_SHM_SEGHEAD *sp;
   int h, sz, nitems;

   if (NULL == filename) return(SHARED_NULPTR);         /* currently ignored */
   if (NULL == driverhandle) return(SHARED_NULPTR);
   nitems = sscanf(filename, "h%d", &h);
   if (1 != nitems) return(SHARED_BADARG);

   if (SHARED_INVALID == (h = shared_malloc(sz = 2880 + sizeof(DAL_SHM_SEGHEAD), 
                        SHARED_RESIZE | SHARED_PERSIST, h)))
     return(SHARED_NOMEM);

   if (NULL == (sp = (DAL_SHM_SEGHEAD *)shared_lock(h, SHARED_RDWRITE)))
     { shared_free(h);
       return(SHARED_BADARG);
     }

   sp->ID = DAL_SHM_SEGHEAD_ID;
   sp->h = h;
   sp->size = sz;
   sp->nodeidx = -1;

   *driverhandle = h;
   
   return(0);
 }